

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O3

void __thiscall
amrex::FluxRegister::FineSetVal
          (FluxRegister *this,int dir,int boxno,int destcomp,int numcomp,Real val,RunOn runon)

{
  BaseFab<double> *pBVar1;
  int iVar2;
  Real local_38;
  
  local_38 = val;
  iVar2 = FabArrayBase::localindex((FabArrayBase *)((this->super_BndryRegister).bndry + dir),boxno);
  pBVar1 = *(BaseFab<double> **)
            ((long)(this->super_BndryRegister).bndry[dir].m_mf.super_FabArray<amrex::FArrayBox>.
                   m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)iVar2 * 8);
  BaseFab<double>::setVal<(amrex::RunOn)1>
            (pBVar1,&local_38,&pBVar1->domain,(DestComp)destcomp,(NumComps)numcomp);
  iVar2 = FabArrayBase::localindex
                    ((FabArrayBase *)((this->super_BndryRegister).bndry + (dir + 3)),boxno);
  pBVar1 = *(BaseFab<double> **)
            ((long)(this->super_BndryRegister).bndry[dir + 3].m_mf.super_FabArray<amrex::FArrayBox>.
                   m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)iVar2 * 8);
  BaseFab<double>::setVal<(amrex::RunOn)1>
            (pBVar1,&local_38,&pBVar1->domain,(DestComp)destcomp,(NumComps)numcomp);
  return;
}

Assistant:

void
FluxRegister::FineSetVal (int              dir,
                          int              boxno,
                          int              destcomp,
                          int              numcomp,
                          Real             val,
                          RunOn            runon) noexcept
{
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    FArrayBox& loreg = bndry[Orientation(dir,Orientation::low)][boxno];
    BL_ASSERT(numcomp <= loreg.nComp());
    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion()) {
        loreg.setVal<RunOn::Device>(val, loreg.box(), destcomp, numcomp);
    } else {
        loreg.setVal<RunOn::Host>(val, loreg.box(), destcomp, numcomp);
    }

    FArrayBox& hireg = bndry[Orientation(dir,Orientation::high)][boxno];
    BL_ASSERT(numcomp <= hireg.nComp());
    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion()) {
        hireg.setVal<RunOn::Device>(val, hireg.box(), destcomp, numcomp);
    } else {
        hireg.setVal<RunOn::Host>(val, hireg.box(), destcomp, numcomp);
    }
}